

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

bool __thiscall Imath_3_2::Matrix44<double>::operator==(Matrix44<double> *this,Matrix44<double> *v)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = this->x[0][0];
  if ((((((((dVar2 == v->x[0][0]) && (!NAN(dVar2) && !NAN(v->x[0][0]))) &&
          (dVar2 = this->x[0][1], pdVar1 = v->x[0] + 1, dVar2 == *pdVar1)) &&
         (((!NAN(dVar2) && !NAN(*pdVar1) &&
           (dVar2 = this->x[0][2], pdVar1 = v->x[0] + 2, dVar2 == *pdVar1)) &&
          ((!NAN(dVar2) && !NAN(*pdVar1) &&
           ((dVar2 = this->x[0][3], pdVar1 = v->x[0] + 3, dVar2 == *pdVar1 &&
            (!NAN(dVar2) && !NAN(*pdVar1))))))))) && (dVar2 = this->x[1][0], dVar2 == v->x[1][0]))
       && (((!NAN(dVar2) && !NAN(v->x[1][0]) &&
            (dVar2 = this->x[1][1], pdVar1 = v->x[1] + 1, dVar2 == *pdVar1)) &&
           (!NAN(dVar2) && !NAN(*pdVar1))))) &&
      (((dVar2 = this->x[1][2], pdVar1 = v->x[1] + 2, dVar2 == *pdVar1 &&
        (!NAN(dVar2) && !NAN(*pdVar1))) &&
       ((dVar2 = this->x[1][3], pdVar1 = v->x[1] + 3, dVar2 == *pdVar1 &&
        ((!NAN(dVar2) && !NAN(*pdVar1) && (dVar2 = this->x[2][0], dVar2 == v->x[2][0])))))))) &&
     (((!NAN(dVar2) && !NAN(v->x[2][0]) &&
       (((((dVar2 = this->x[2][1], pdVar1 = v->x[2] + 1, dVar2 == *pdVar1 &&
           (!NAN(dVar2) && !NAN(*pdVar1))) &&
          (dVar2 = this->x[2][2], pdVar1 = v->x[2] + 2, dVar2 == *pdVar1)) &&
         ((!NAN(dVar2) && !NAN(*pdVar1) &&
          (dVar2 = this->x[2][3], pdVar1 = v->x[2] + 3, dVar2 == *pdVar1)))) &&
        ((!NAN(dVar2) && !NAN(*pdVar1) &&
         ((dVar2 = this->x[3][0], dVar2 == v->x[3][0] && (!NAN(dVar2) && !NAN(v->x[3][0]))))))))) &&
      ((dVar2 = this->x[3][1], pdVar1 = v->x[3] + 1, dVar2 == *pdVar1 &&
       (((!NAN(dVar2) && !NAN(*pdVar1) &&
         (dVar2 = this->x[3][2], pdVar1 = v->x[3] + 2, dVar2 == *pdVar1)) &&
        (!NAN(dVar2) && !NAN(*pdVar1))))))))) {
    return (bool)(-(v->x[3][3] == this->x[3][3]) & 1);
  }
  return false;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline bool
Matrix44<T>::operator== (const Matrix44& v) const IMATH_NOEXCEPT
{
    return x[0][0] == v.x[0][0] && x[0][1] == v.x[0][1] &&
           x[0][2] == v.x[0][2] && x[0][3] == v.x[0][3] &&
           x[1][0] == v.x[1][0] && x[1][1] == v.x[1][1] &&
           x[1][2] == v.x[1][2] && x[1][3] == v.x[1][3] &&
           x[2][0] == v.x[2][0] && x[2][1] == v.x[2][1] &&
           x[2][2] == v.x[2][2] && x[2][3] == v.x[2][3] &&
           x[3][0] == v.x[3][0] && x[3][1] == v.x[3][1] &&
           x[3][2] == v.x[3][2] && x[3][3] == v.x[3][3];
}